

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTCTE.cpp
# Opt level: O2

void __thiscall
glcts::TessellationShaderTCTEgl_PatchVerticesIn::deinitTestDescriptor
          (TessellationShaderTCTEgl_PatchVerticesIn *this,_test_descriptor *test_ptr)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  TestCaseBase::deinit(&this->super_TestCaseBase);
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (test_ptr->fs_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    test_ptr->fs_id = 0;
  }
  if (test_ptr->po_id != 0) {
    (**(code **)(lVar2 + 0x448))();
    test_ptr->po_id = 0;
  }
  if (test_ptr->tcs_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    test_ptr->tcs_id = 0;
  }
  if (test_ptr->tes_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    test_ptr->tes_id = 0;
  }
  if (test_ptr->vs_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    test_ptr->vs_id = 0;
  }
  return;
}

Assistant:

void TessellationShaderTCTEgl_PatchVerticesIn::deinitTestDescriptor(_test_descriptor* test_ptr)
{
	/* Call base class' deinit() */
	TestCaseBase::deinit();

	/* Release all objects */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (test_ptr->fs_id != 0)
	{
		gl.deleteShader(test_ptr->fs_id);

		test_ptr->fs_id = 0;
	}

	if (test_ptr->po_id != 0)
	{
		gl.deleteProgram(test_ptr->po_id);

		test_ptr->po_id = 0;
	}

	if (test_ptr->tcs_id != 0)
	{
		gl.deleteShader(test_ptr->tcs_id);

		test_ptr->tcs_id = 0;
	}

	if (test_ptr->tes_id != 0)
	{
		gl.deleteShader(test_ptr->tes_id);

		test_ptr->tes_id = 0;
	}

	if (test_ptr->vs_id != 0)
	{
		gl.deleteShader(test_ptr->vs_id);

		test_ptr->vs_id = 0;
	}
}